

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poiseuille.cc
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *this;
  Index *this_00;
  Entity *pEVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  anon_class_16_2_11d81ae5_for_f_ f_00;
  anon_class_16_2_11d81ae5_for_f_ f_01;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  size_type *psVar11;
  element_type *peVar12;
  UniformFEDofHandler *this_01;
  element_type *peVar13;
  __tuple_element_t<0UL,_tuple<COOMatrix<double>,_Matrix<double,__1,_1,_0,__1,_1>,_Matrix<double,__1,_1,_0,__1,_1>_>_>
  *p_Var14;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar15;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar16;
  reference pvVar17;
  element_type *peVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MatrixXd *pMVar19;
  Matrix<double,_2,_1,_0,_2,_1> *this_02;
  undefined4 extraout_var_01;
  reference ppEVar20;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  Matrix<double,2,1,0,2,1> *this_03;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar21;
  double DG_modified;
  double L2_modified;
  double DG;
  double L2;
  undefined1 local_ef0 [7];
  anon_class_1_0_00000001 qr_provider;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
  diff_g_modified;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
  diff_g;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
  diff_v_modified;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
  diff_v;
  Vector2d local_e28;
  allocator<char> local_e11;
  string local_e10;
  int local_df0 [2];
  Vector2d local_de8;
  uint local_dd4;
  string local_dd0;
  Scalar local_db0;
  ConstantReturnType local_da8;
  MatrixXd local_d98;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_d80;
  Entity *local_d68;
  Entity *ep_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_1;
  undefined1 local_d28 [8];
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> v_modified;
  string local_ce8;
  anon_class_16_2_11d81ae5_for_f_ local_cc8;
  RefEl local_ca9;
  size_type local_ca8;
  RefEl local_ca1;
  Matrix<double,__1,__1,_0,__1,__1> local_ca0;
  VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_c88;
  SumReturnType local_c80;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c70;
  Matrix<double,2,1,0,2,1> local_c38 [8];
  Vector2d center;
  Entity *ep;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  undefined1 local_be0 [8];
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> v;
  undefined1 local_b98 [8];
  MeshFunctionVelocity<double,_double> velocity_modified;
  undefined1 local_b68 [8];
  MeshFunctionVelocity<double,_double> velocity;
  undefined1 local_b30 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>
  gradient_exact;
  undefined1 local_b08 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>
  velocity_exact;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space;
  size_type lvl_1;
  shared_ptr<const_lf::mesh::Mesh> local_ab8;
  undefined1 local_aa8 [8];
  VtkWriter writer;
  anon_class_16_2_11d81ae5_for_f_ analytic_gradient;
  anon_class_16_2_11d81ae5_for_f_ analytic_velocity;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_8a0;
  undefined1 local_880 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver_modified;
  type *offset_function_modified;
  type *rhs_modified;
  type *A_modified;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> local_5a8;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_588;
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_568;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_528;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_518;
  undefined1 local_4f8 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  type *offset_function;
  type *rhs;
  type *A;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> local_220;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_200;
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1e0;
  undefined1 local_1a0 [8];
  anon_class_16_2_430c1e5d dirichlet_funct;
  int local_188;
  anon_class_1_0_00000001 f;
  RefEl local_181;
  int local_180;
  RefEl local_179;
  pair<const_lf::base::RefEl,_unsigned_int> local_178;
  pair<const_lf::base::RefEl,_unsigned_int> local_170;
  iterator local_168;
  size_type local_160;
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_158;
  shared_ptr<const_lf::mesh::Mesh> local_128;
  shared_ptr<const_lf::assemble::DofHandler> local_118;
  reference local_108;
  value_type *sol;
  shared_ptr<lf::mesh::Mesh> *local_f0;
  shared_ptr<lf::mesh::Mesh> *mesh;
  size_type lvl;
  vector<ProblemSolution,_std::allocator<ProblemSolution>_> solutions;
  shared_ptr<lf::refinement::MeshHierarchy> mesh_hierarchy;
  shared_ptr<lf::mesh::Mesh> mesh0;
  int local_a0 [4];
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_90;
  undefined1 local_88 [8];
  TPTriagMeshBuilder builder;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_40;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_38;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> factory;
  double h;
  double flowrate;
  char **ppcStack_18;
  uint refinement_level;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  flowrate._4_4_ = 6;
  h = 1.0;
  factory._M_t.
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (__uniq_ptr_data<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>,_true,_true>
        )(__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)
         0x3fd0000000000000;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    builder.super_StructuredMeshBuilder._60_4_ = 2;
    std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_40);
    std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
              ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
               &local_38,&local_40);
    std::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
    ::~unique_ptr(&local_40);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
              (&local_90,&local_38);
    lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
              ((TPTriagMeshBuilder *)local_88,&local_90);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_90);
    lf::mesh::utils::StructuredMeshBuilder::setBottomLeftCorner
              ((StructuredMeshBuilder *)local_88,0.0,0.0);
    lf::mesh::utils::StructuredMeshBuilder::setTopRightCorner
              ((StructuredMeshBuilder *)local_88,2.0,0.5);
    iVar7 = strcmp(ppcStack_18[1],"irregular");
    if (iVar7 == 0) {
      local_a0[0] = 2;
      mesh0.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           0;
      psVar11 = (size_type *)
                std::max<int>(local_a0,(int *)((long)&mesh0.
                                                  super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 4));
      lf::mesh::utils::StructuredMeshBuilder::setNumXCells
                ((StructuredMeshBuilder *)local_88,*psVar11);
    }
    else {
      lf::mesh::utils::StructuredMeshBuilder::setNumXCells((StructuredMeshBuilder *)local_88,8);
    }
    lf::mesh::utils::StructuredMeshBuilder::setNumYCells((StructuredMeshBuilder *)local_88,2);
    lf::mesh::utils::TPTriagMeshBuilder::Build
              ((TPTriagMeshBuilder *)
               &mesh_hierarchy.
                super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lf::refinement::GenerateMeshHierarchyByUniformRefinemnt
              ((refinement *)
               &solutions.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (shared_ptr<lf::mesh::Mesh> *)
               &mesh_hierarchy.
                super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,6,rp_regular);
    std::allocator<ProblemSolution>::allocator((allocator<ProblemSolution> *)((long)&mesh + 7));
    std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::vector
              ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,7,
               (allocator<ProblemSolution> *)((long)&mesh + 7));
    std::allocator<ProblemSolution>::~allocator((allocator<ProblemSolution> *)((long)&mesh + 7));
    for (mesh._0_4_ = 0; (uint)mesh < 7; mesh._0_4_ = (uint)mesh + 1) {
      peVar12 = std::
                __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&solutions.
                                 super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)&sol,(size_type)peVar12);
      local_f0 = (shared_ptr<lf::mesh::Mesh> *)&sol;
      local_108 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                             (ulong)(uint)mesh);
      std::shared_ptr<lf::mesh::Mesh_const>::operator=
                ((shared_ptr<lf::mesh::Mesh_const> *)local_108,local_f0);
      this_01 = (UniformFEDofHandler *)operator_new(0xb8);
      dirichlet_funct.flowrate._5_1_ = 1;
      std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
                ((shared_ptr<lf::mesh::Mesh_const> *)&local_128,local_f0);
      local_179 = lf::base::RefEl::kPoint();
      local_180 = 1;
      std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
                (&local_178,&local_179,&local_180);
      local_181 = lf::base::RefEl::kSegment();
      local_188 = 1;
      std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
                (&local_170,&local_181,&local_188);
      local_168 = &local_178;
      local_160 = 2;
      this = (allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *)
             ((long)&dirichlet_funct.flowrate + 6);
      std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::allocator(this);
      __l._M_len = local_160;
      __l._M_array = local_168;
      std::
      map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
      ::map(&local_158,__l,(less<lf::base::RefEl> *)((long)&dirichlet_funct.flowrate + 7),this);
      lf::assemble::UniformFEDofHandler::UniformFEDofHandler(this_01,&local_128,&local_158,true);
      dirichlet_funct.flowrate._5_1_ = 0;
      std::shared_ptr<lf::assemble::DofHandler_const>::
      shared_ptr<lf::assemble::UniformFEDofHandler,void>
                ((shared_ptr<lf::assemble::DofHandler_const> *)&local_118,this_01);
      std::shared_ptr<const_lf::assemble::DofHandler>::operator=(&local_108->dofh,&local_118);
      std::shared_ptr<const_lf::assemble::DofHandler>::~shared_ptr(&local_118);
      std::
      map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
      ::~map(&local_158);
      std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::~allocator
                ((allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *)
                 ((long)&dirichlet_funct.flowrate + 6));
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_128);
      pvVar17 = local_108;
      dirichlet_funct.flowrate._4_1_ = 0;
      local_1a0 = (undefined1  [8])&factory;
      dirichlet_funct.h = &h;
      peVar13 = std::
                __shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_108->dofh);
      std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>::
      function<main::__0&,void>
                ((function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)> *
                 )&local_200,(anon_class_1_0_00000001 *)((long)&dirichlet_funct.flowrate + 4));
      std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>::
      function<main::__1&,void>
                ((function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)> *)&local_220,
                 (anon_class_16_2_430c1e5d *)local_1a0);
      lf::quad::make_TriaQR_MidpointRule();
      projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
                (&local_1e0,&pvVar17->mesh,peVar13,&local_200,&local_220,100.0,(QuadRule *)&A,false)
      ;
      lf::quad::QuadRule::~QuadRule((QuadRule *)&A);
      std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::~function
                (&local_220);
      std::
      function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
      ::~function(&local_200);
      p_Var14 = std::
                get<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_1e0);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                std::
                get<1ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_1e0);
      pMVar16 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                std::
                get<2ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_1e0);
      lf::assemble::COOMatrix<double>::makeSparse
                ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC,p_Var14);
      Eigen::SparseMatrix<double,_0,_int>::operator=
                (&local_108->A,(SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
      Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (&local_108->rhs,(Matrix<double,__1,_1,_0,__1,_1> *)pMVar15);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_4f8);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_4f8,&local_108->A);
      SVar21 = Eigen::
               SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
               ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                           *)local_4f8,pMVar15);
      local_528 = SVar21;
      Eigen::
      MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,-1,1,0,-1,1>>>
      ::operator+(&local_518,
                  (MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                   *)&local_528,pMVar16);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)&local_108->solution,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_518);
      pvVar17 = local_108;
      peVar13 = std::
                __shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_108->dofh);
      std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>::
      function<main::__0&,void>
                ((function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)> *
                 )&local_588,(anon_class_1_0_00000001 *)((long)&dirichlet_funct.flowrate + 4));
      std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>::
      function<main::__1&,void>
                ((function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)> *)&local_5a8,
                 (anon_class_16_2_430c1e5d *)local_1a0);
      lf::quad::make_TriaQR_MidpointRule();
      projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
                (&local_568,&pvVar17->mesh,peVar13,&local_588,&local_5a8,100.0,
                 (QuadRule *)&A_modified,true);
      lf::quad::QuadRule::~QuadRule((QuadRule *)&A_modified);
      std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::~function
                (&local_5a8);
      std::
      function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
      ::~function(&local_588);
      p_Var14 = std::
                get<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_568);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                std::
                get<1ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_568);
      pMVar16 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                std::
                get<2ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&local_568);
      lf::assemble::COOMatrix<double>::makeSparse
                ((SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC,p_Var14);
      Eigen::SparseMatrix<double,_0,_int>::operator=
                (&local_108->A_modified,(SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC)
      ;
      Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                ((SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_880,&local_108->A_modified);
      SVar21 = Eigen::
               SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
               ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                           *)local_880,pMVar15);
      analytic_velocity.h = (double *)SVar21.m_dec;
      Eigen::
      MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,-1,1,0,-1,1>>>
      ::operator+(&local_8a0,
                  (MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                   *)&analytic_velocity.h,pMVar16);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)&local_108->solution_modified,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_8a0);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_880);
      std::
      tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::~tuple(&local_568);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_4f8);
      std::
      tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::~tuple(&local_1e0);
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&sol);
    }
    writer.aux_node_offset_._M_elems[1]._48_8_ = &h;
    analytic_gradient.flowrate = (double *)&factory;
    analytic_gradient.h = (double *)writer.aux_node_offset_._M_elems[1]._48_8_;
    analytic_velocity.flowrate = analytic_gradient.flowrate;
    pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::back
                        ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
    std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_ab8,&pvVar17->mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lvl_1,"result.vtk",
               (allocator<char> *)
               ((long)&fe_space.
                       super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    lf::io::VtkWriter::VtkWriter((VtkWriter *)local_aa8,&local_ab8,(string *)&lvl_1,0,'\x01');
    std::__cxx11::string::~string((string *)&lvl_1);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fe_space.
                       super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_ab8);
    for (fe_space.
         super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._0_4_ = 0;
        (uint)fe_space.
              super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi < 7;
        fe_space.
        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ =
             (uint)fe_space.
                   super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi + 1) {
      std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                 (ulong)(uint)fe_space.
                              super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
      std::
      make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>&>
                ((shared_ptr<const_lf::mesh::Mesh> *)&velocity_exact.f_.h);
      gradient_exact.f_.h = analytic_gradient.h;
      f_01.h = analytic_velocity.flowrate;
      f_01.flowrate = analytic_gradient.h;
      lf::mesh::utils::
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/poiseuille/poiseuille.cc:163:28)>
      ::MeshFunctionGlobal
                ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>
                  *)local_b08,f_01);
      velocity.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = writer.aux_node_offset_._M_elems[1]._48_8_;
      f_00.h = analytic_gradient.flowrate;
      f_00.flowrate = (double *)writer.aux_node_offset_._M_elems[1]._48_8_;
      lf::mesh::utils::
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/poiseuille/poiseuille.cc:169:28)>
      ::MeshFunctionGlobal
                ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>
                  *)local_b30,f_00);
      this_00 = &velocity_modified.grad_.dof_vector_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)this_00,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_.h);
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
      MeshFunctionVelocity
                ((MeshFunctionVelocity<double,_double> *)local_b68,
                 (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this_00,
                 &pvVar17->solution);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
                 &velocity_modified.grad_.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
      shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
                ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)&v.codim_,
                 (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_.h);
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
      MeshFunctionVelocity
                ((MeshFunctionVelocity<double,_double> *)local_b98,
                 (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)&v.codim_,
                 &pvVar17->solution_modified);
      std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
                ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)&v.codim_);
      if ((uint)fe_space.
                super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi == 6) {
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::back
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
        std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
                  ((shared_ptr<const_lf::mesh::Mesh> *)&__range3,&pvVar17->mesh);
        lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
                  ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_be0,
                   (shared_ptr<const_lf::mesh::Mesh> *)&__range3,0);
        std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                  ((shared_ptr<const_lf::mesh::Mesh> *)&__range3);
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::back
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
        peVar18 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)pvVar17);
        iVar7 = (*peVar18->_vptr_Mesh[2])(peVar18,0);
        __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar7);
        __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3
                           );
        ep = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
        while( true ) {
          bVar6 = __gnu_cxx::
                  operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                      *)&ep);
          if (((bVar6 ^ 0xffU) & 1) == 0) break;
          ppEVar20 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end3);
          pEVar1 = *ppEVar20;
          iVar7 = (*pEVar1->_vptr_Entity[3])();
          iVar8 = (*pEVar1->_vptr_Entity[4])();
          local_ca1.type_ = (RefElType)iVar8;
          pMVar19 = lf::base::RefEl::NodeCoords(&local_ca1);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x18))
                    (&local_ca0,(long *)CONCAT44(extraout_var_00,iVar7),pMVar19);
          local_c88.m_matrix =
               (ExpressionTypeNested)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_ca0);
          Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
                    (&local_c80,&local_c88);
          iVar7 = (*pEVar1->_vptr_Entity[4])();
          local_ca9.type_ = (RefElType)iVar7;
          local_ca8 = lf::base::RefEl::NumNodes(&local_ca9);
          Eigen::
          MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::member_sum<double,double>,1>>
          ::operator/(&local_c70,
                      (MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
                       *)&local_c80,&local_ca8);
          Eigen::Matrix<double,2,1,0,2,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                    (local_c38,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_c70);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_ca0);
          lf::mesh::utils::
          MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/poiseuille/poiseuille.cc:163:28)>
          ::anon_class_16_2_11d81ae5_for_f_::operator()(&local_cc8,(Vector2d *)&analytic_gradient.h)
          ;
          this_02 = lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::
                    operator()((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_be0,
                               pEVar1);
          Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
                    (this_02,(Matrix<double,_2,_1,_0,_2,_1> *)&local_cc8);
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end3);
        }
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                             (ulong)(uint)fe_space.
                                          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
        peVar18 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)pvVar17);
        v_modified._52_4_ = (*peVar18->_vptr_Mesh[3])(peVar18,2);
        concat<char_const(&)[3],unsigned_int>
                  (&local_ce8,(char (*) [3])"v_",(uint *)&v_modified.field_0x34);
        lf::io::VtkWriter::
        WriteCellData<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                  ((VtkWriter *)local_aa8,&local_ce8,
                   (MeshFunctionVelocity<double,_double> *)local_b68);
        std::__cxx11::string::~string((string *)&local_ce8);
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::back
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
        std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
                  ((shared_ptr<const_lf::mesh::Mesh> *)&__range3_1,&pvVar17->mesh);
        lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
                  ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_d28,
                   (shared_ptr<const_lf::mesh::Mesh> *)&__range3_1,0);
        std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                  ((shared_ptr<const_lf::mesh::Mesh> *)&__range3_1);
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::back
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
        peVar18 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)pvVar17);
        iVar7 = (*peVar18->_vptr_Mesh[2])(peVar18,0);
        __begin3_1._M_current = (Entity **)CONCAT44(extraout_var_01,iVar7);
        __end3_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin3_1);
        ep_1 = (Entity *)
               std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1
                         );
        while( true ) {
          bVar6 = __gnu_cxx::
                  operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            (&__end3_1,
                             (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                              *)&ep_1);
          if (((bVar6 ^ 0xffU) & 1) == 0) break;
          ppEVar20 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end3_1);
          pEVar1 = *ppEVar20;
          local_db0 = 0.3333333333333333;
          local_d68 = pEVar1;
          Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant(&local_da8,&local_db0);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_d98,
                     (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      *)&local_da8);
          projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::operator()
                    (&local_d80,(MeshFunctionVelocity<double,_double> *)local_b98,pEVar1,&local_d98)
          ;
          other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  std::
                  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[](&local_d80,0);
          this_03 = (Matrix<double,2,1,0,2,1> *)
                    lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::
                    operator()((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_d28,
                               local_d68);
          Eigen::Matrix<double,2,1,0,2,1>::operator=(this_03,other);
          std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::~vector(&local_d80);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d98);
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end3_1);
        }
        pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                             (ulong)(uint)fe_space.
                                          super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
        peVar18 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)pvVar17);
        local_dd4 = (*peVar18->_vptr_Mesh[3])(peVar18,2);
        concat<char_const(&)[13],unsigned_int>(&local_dd0,(char (*) [13])"v__modified_",&local_dd4);
        local_df0[1] = 0;
        local_df0[0] = 0;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
                  ((Matrix<double,2,1,0,2,1> *)&local_de8,local_df0 + 1,local_df0);
        lf::io::VtkWriter::WriteCellData
                  ((VtkWriter *)local_aa8,&local_dd0,
                   (MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_d28,&local_de8);
        std::__cxx11::string::~string((string *)&local_dd0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e10,"analytic",&local_e11);
        diff_v.b_.f_.h._4_4_ = 0;
        diff_v.b_.f_.h._0_4_ = 0;
        Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
                  ((Matrix<double,2,1,0,2,1> *)&local_e28,(int *)((long)&diff_v.b_.f_.h + 4),
                   (int *)&diff_v.b_.f_.h);
        lf::io::VtkWriter::WriteCellData
                  ((VtkWriter *)local_aa8,&local_e10,
                   (MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_be0,&local_e28);
        std::__cxx11::string::~string((string *)&local_e10);
        std::allocator<char>::~allocator(&local_e11);
        lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CodimMeshDataSet
                  ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_d28);
        lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CodimMeshDataSet
                  ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_be0);
      }
      lf::mesh::utils::
      operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                  *)&diff_v_modified.b_.f_.h,(MeshFunctionVelocity<double,_double> *)local_b68,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>
                  *)local_b08);
      lf::mesh::utils::
      operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                  *)&diff_g.mf_.f_.h,(MeshFunctionVelocity<double,_double> *)local_b98,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>
                  *)local_b08);
      lf::mesh::utils::
      operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                  *)&diff_g_modified.mf_.f_.h,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>
                  *)local_b30);
      lf::mesh::utils::
      operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                  *)local_ef0,
                 (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>
                  *)local_b30);
      L2._7_1_ = 0;
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      dVar2 = projects::ipdg_stokes::post_processing::
              L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__2>>,main::__4>
                        (&pvVar17->mesh,
                         (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                          *)&diff_v_modified.b_.f_.h,(anon_class_1_0_00000001 *)((long)&L2 + 7));
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      dVar3 = projects::ipdg_stokes::post_processing::
              DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__2>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__3>>,main::__4>
                        (&pvVar17->mesh,
                         (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                          *)&diff_v_modified.b_.f_.h,
                         (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                          *)&diff_g_modified.mf_.f_.h,(anon_class_1_0_00000001 *)((long)&L2 + 7));
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      dVar4 = projects::ipdg_stokes::post_processing::
              L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__2>>,main::__4>
                        (&pvVar17->mesh,
                         (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                          *)&diff_g.mf_.f_.h,(anon_class_1_0_00000001 *)((long)&L2 + 7));
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      dVar5 = projects::ipdg_stokes::post_processing::
              DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__2>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__3>>,main::__4>
                        (&pvVar17->mesh,
                         (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                          *)&diff_g.mf_.f_.h,
                         (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:169:28)>_>
                          *)local_ef0,(anon_class_1_0_00000001 *)((long)&L2 + 7));
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (&std::cout,
                           (uint)fe_space.
                                 super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
      poVar10 = std::operator<<(poVar10,' ');
      pvVar17 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl,
                           (ulong)(uint)fe_space.
                                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
      peVar18 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)pvVar17);
      uVar9 = (*peVar18->_vptr_Mesh[3])(peVar18,2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar9);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar2);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar3);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar4);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar5);
      std::operator<<(poVar10,'\n');
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/poiseuille/poiseuille.cc:163:28)>_>
      ::~MeshFunctionBinary
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                  *)&diff_g.mf_.f_.h);
      lf::mesh::utils::
      MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/poiseuille/poiseuille.cc:163:28)>_>
      ::~MeshFunctionBinary
                ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_poiseuille_poiseuille_cc:163:28)>_>
                  *)&diff_v_modified.b_.f_.h);
      projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
      ~MeshFunctionVelocity((MeshFunctionVelocity<double,_double> *)local_b98);
      projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
      ~MeshFunctionVelocity((MeshFunctionVelocity<double,_double> *)local_b68);
      std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
                ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_.h);
    }
    argv_local._4_4_ = 0;
    lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_aa8);
    std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::~vector
              ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)&lvl);
    std::shared_ptr<lf::refinement::MeshHierarchy>::~shared_ptr
              ((shared_ptr<lf::refinement::MeshHierarchy> *)
               &solutions.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<lf::mesh::Mesh> *)
               &mesh_hierarchy.
                super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lf::mesh::utils::TPTriagMeshBuilder::~TPTriagMeshBuilder((TPTriagMeshBuilder *)local_88);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_38);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar10 = std::operator<<(poVar10,*ppcStack_18);
    poVar10 = std::operator<<(poVar10,"[regular,stretched]");
    std::operator<<(poVar10,'\n');
    poVar10 = std::operator<<((ostream *)&std::cerr,
                              "\tregular  : Builds a mesh where the resolution in the x- and y-direction are equal"
                             );
    std::operator<<(poVar10,'\n');
    poVar10 = std::operator<<((ostream *)&std::cerr,
                              "\tirregular: Builds a mesh where the resolution in the x-direction is 10 times less than in the y-direction"
                             );
    std::operator<<(poVar10,'\n');
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  const unsigned refinement_level = 6;
  const double flowrate = 1;
  const double h = 0.25;

  if (argc != 2) {
    std::cerr << "Usage: " << argv[0] << "[regular,stretched]" << '\n';
    std::cerr << "\tregular  : Builds a mesh where the resolution in the x- "
                 "and y-direction are equal"
              << '\n';
    std::cerr << "\tirregular: Builds a mesh where the resolution in the "
                 "x-direction is 10 times less than in the y-direction"
              << '\n';
    return 1;
  }

  // Read the mesh from the gmsh file
  std::unique_ptr<lf::mesh::MeshFactory> factory =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  lf::mesh::utils::TPTriagMeshBuilder builder(std::move(factory));
  builder.setBottomLeftCorner(0, 0);
  builder.setTopRightCorner(2, 2 * h);
  if (strcmp(argv[1], "irregular") == 0) {
    builder.setNumXCells(std::max(2, 2 * static_cast<int>(1.0 / h) / 10));
  } else {
    builder.setNumXCells(2 * static_cast<int>(1.0 / h));
  }
  builder.setNumYCells(2);
  auto mesh0 = builder.Build();

  // Generate a mesh hierarchy by regular refinement
  const auto mesh_hierarchy =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(mesh0,
                                                              refinement_level);

  // Solve the problem for each mesh in the hierarchy
  std::vector<ProblemSolution> solutions(refinement_level + 1);
  for (lf::base::size_type lvl = 0; lvl < refinement_level + 1; ++lvl) {
    const auto &mesh = mesh_hierarchy->getMesh(lvl);
    auto &sol = solutions[lvl];
    sol.mesh = mesh;
    sol.dofh = std::shared_ptr<const lf::assemble::DofHandler>(
        new lf::assemble::UniformFEDofHandler(
            mesh, {{lf::base::RefEl::kPoint(), 1},
                   {lf::base::RefEl::kSegment(), 1}}));
    // No volume forces are present
    auto f = [](const Eigen::Vector2d & /*unused*/) -> Eigen::Vector2d {
      return Eigen::Vector2d::Zero();
    };
    // Enforce a Poiseuille in- and outflow and no-slip boundary conditions at
    // the tube boundaries
    auto dirichlet_funct =
        [&](const lf::mesh::Entity &edge) -> Eigen::Vector2d {
      static constexpr double eps = 1e-10;
      const auto *const geom = edge.Geometry();
      const auto vertices = geom->Global(edge.RefEl().NodeCoords());
      const Eigen::Vector2d midpoint = vertices.rowwise().sum() / 2;
      Eigen::Vector2d v = Eigen::Vector2d::Zero();
      if (vertices(0, 0) >= -eps && vertices(0, 0) <= eps &&
          vertices(0, 1) >= -eps && vertices(0, 1) <= eps) {
        // The edge is part of the inflow boundary
        v << poiseuilleVelocity(h, flowrate, midpoint[1] - h), 0;
      }
      if (vertices(0, 0) >= 2 - eps && vertices(0, 0) <= 2 + eps &&
          vertices(0, 1) >= 2 - eps && vertices(0, 1) <= 2 + eps) {
        // The edge is part of the outflow boundary
        v << poiseuilleVelocity(h, flowrate, midpoint[1] - h), 0;
      }
      return v;
    };
    const auto [A, rhs, offset_function] =
        projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 100,
            lf::quad::make_TriaQR_MidpointRule(), false);
    sol.A = A.makeSparse();
    sol.rhs = rhs;
    Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
    solver.compute(sol.A);
    sol.solution = solver.solve(rhs) + offset_function;
    const auto [A_modified, rhs_modified, offset_function_modified] =
        projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 100,
            lf::quad::make_TriaQR_MidpointRule(), true);
    sol.A_modified = A_modified.makeSparse();
    const Eigen::SparseLU<Eigen::SparseMatrix<double>> solver_modified(
        sol.A_modified);
    sol.solution_modified =
        solver_modified.solve(rhs_modified) + offset_function_modified;
  }

  // Compute the analytic solution of the problem
  auto analytic_velocity = [&](const Eigen::Vector2d &x) -> Eigen::Vector2d {
    const double u_max = flowrate * 3 / 4 / h;
    Eigen::Vector2d v;
    v << u_max * (1 - (x[1] - h) * (x[1] - h) / h / h), 0;
    return v;
  };
  auto analytic_gradient = [&](const Eigen::Vector2d &x) -> Eigen::Matrix2d {
    const double u_max = flowrate * 3 / 4 / h;
    Eigen::Matrix2d g;
    g << 0, 0, u_max * 2 * (x[1] - h) / h / h, 0;
    return g;
  };

  // Perform post processing on the data
  lf::io::VtkWriter writer(solutions.back().mesh, "result.vtk");
  for (lf::base::size_type lvl = 0; lvl <= refinement_level; ++lvl) {
    const auto fe_space =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(
            solutions[lvl].mesh);
    const auto velocity_exact =
        lf::mesh::utils::MeshFunctionGlobal(analytic_velocity);
    const auto gradient_exact =
        lf::mesh::utils::MeshFunctionGlobal(analytic_gradient);
    const auto velocity =
        projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                     double>(
            fe_space, solutions[lvl].solution);
    const auto velocity_modified =
        projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                     double>(
            fe_space, solutions[lvl].solution_modified);
    // Store the result on the finest mesh to vtk
    if (lvl == refinement_level) {
      lf::mesh::utils::CodimMeshDataSet<Eigen::Vector2d> v(
          solutions.back().mesh, 0);
      for (const auto *ep : solutions.back().mesh->Entities(0)) {
        const Eigen::Vector2d center =
            ep->Geometry()->Global(ep->RefEl().NodeCoords()).rowwise().sum() /
            ep->RefEl().NumNodes();
        v(*ep) = analytic_velocity(center);
      }
      writer.WriteCellData(concat("v_", solutions[lvl].mesh->NumEntities(2)),
                           velocity);

      lf::mesh::utils::CodimMeshDataSet<Eigen::Vector2d> v_modified(
          solutions.back().mesh, 0);
      for (const auto *ep : solutions.back().mesh->Entities(0)) {
        v_modified(*ep) =
            velocity_modified(*ep, Eigen::Vector2d::Constant(1. / 3))[0];
      }
      writer.WriteCellData(
          concat("v__modified_", solutions[lvl].mesh->NumEntities(2)),
          v_modified);
      writer.WriteCellData("analytic", v);
    }
    // Compute the error in the velocity
    auto diff_v = velocity - velocity_exact;
    auto diff_v_modified = velocity_modified - velocity_exact;
    // Compute the error in the gradient of the velocity
    auto diff_g = -gradient_exact;
    auto diff_g_modified = -gradient_exact;
    const auto qr_provider = [](const lf::mesh::Entity &e) {
      return lf::quad::make_QuadRule(e.RefEl(), 0);
    };
    const double L2 = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v, qr_provider);
    const double DG = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v, diff_g, qr_provider);
    const double L2_modified = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_modified, qr_provider);
    const double DG_modified = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_modified, diff_g_modified, qr_provider);
    std::cout << lvl << ' ' << solutions[lvl].mesh->NumEntities(2) << ' ' << L2
              << ' ' << DG << ' ' << L2_modified << ' ' << DG_modified << '\n';
  }

  return 0;
}